

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void sha256_tag_test(void)

{
  uchar tag_4 [16];
  uchar tag_3 [12];
  uchar tag_2 [10];
  char tag_1 [19];
  char tag [12];
  secp256k1_sha256 sha;
  size_t in_stack_ffffffffffffffb0;
  uchar *in_stack_ffffffffffffffb8;
  secp256k1_sha256 *in_stack_ffffffffffffffc0;
  
  secp256k1_musig_keyagglist_sha256((secp256k1_sha256 *)0x163f17);
  sha256_tag_test_internal
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  secp256k1_musig_keyaggcoef_sha256((secp256k1_sha256 *)0x163f63);
  sha256_tag_test_internal
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  secp256k1_nonce_function_musig_sha256_tagged_aux((secp256k1_sha256 *)0x163f99);
  sha256_tag_test_internal
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  secp256k1_nonce_function_musig_sha256_tagged((secp256k1_sha256 *)0x163fcd);
  sha256_tag_test_internal
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  secp256k1_musig_compute_noncehash_sha256_tagged((secp256k1_sha256 *)0x164002);
  sha256_tag_test_internal
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  return;
}

Assistant:

static void sha256_tag_test(void) {
    secp256k1_sha256 sha;
    {
        char tag[] = "KeyAgg list";
        secp256k1_musig_keyagglist_sha256(&sha);
        sha256_tag_test_internal(&sha, (unsigned char*)tag, sizeof(tag) - 1);
    }
    {
        char tag[] = "KeyAgg coefficient";
        secp256k1_musig_keyaggcoef_sha256(&sha);
        sha256_tag_test_internal(&sha, (unsigned char*)tag, sizeof(tag) - 1);
    }
    {
        unsigned char tag[] = "MuSig/aux";
        secp256k1_nonce_function_musig_sha256_tagged_aux(&sha);
        sha256_tag_test_internal(&sha, (unsigned char*)tag, sizeof(tag) - 1);
    }
    {
        unsigned char tag[] = "MuSig/nonce";
        secp256k1_nonce_function_musig_sha256_tagged(&sha);
        sha256_tag_test_internal(&sha, (unsigned char*)tag, sizeof(tag) - 1);
    }
    {
        unsigned char tag[] = "MuSig/noncecoef";
        secp256k1_musig_compute_noncehash_sha256_tagged(&sha);
        sha256_tag_test_internal(&sha, (unsigned char*)tag, sizeof(tag) - 1);
    }
}